

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O3

void HTS_ModelSet_initialize(HTS_ModelSet *ms)

{
  ms->window = (HTS_Window *)0x0;
  ms->stream = (HTS_Model **)0x0;
  ms->option = (char **)0x0;
  ms->duration = (HTS_Model *)0x0;
  ms->fullcontext_version = (char *)0x0;
  ms->gv_off_context = (HTS_Question *)0x0;
  ms->stream_type = (char *)0x0;
  ms->fullcontext_format = (char *)0x0;
  ms->num_states = 0;
  ms->num_streams = 0;
  ms->frame_period = 0;
  ms->num_voices = 0;
  ms->hts_voice_version = (char *)0x0;
  ms->sampling_frequency = 0;
  ms->gv = (HTS_Model **)0x0;
  return;
}

Assistant:

void HTS_ModelSet_initialize(HTS_ModelSet * ms)
{
   ms->hts_voice_version = NULL;
   ms->sampling_frequency = 0;
   ms->frame_period = 0;
   ms->num_voices = 0;
   ms->num_states = 0;
   ms->num_streams = 0;
   ms->stream_type = NULL;
   ms->fullcontext_format = NULL;
   ms->fullcontext_version = NULL;
   ms->gv_off_context = NULL;
   ms->option = NULL;

   ms->duration = NULL;
   ms->window = NULL;
   ms->stream = NULL;
   ms->gv = NULL;
}